

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O2

RK_S32 __thiscall mpp_list::flush(mpp_list *this)

{
  mpp_list_node *__ptr;
  mpp_list_node *pmVar1;
  mpp_list_node *pmVar2;
  int iVar3;
  
  if (this->head != (mpp_list_node *)0x0) {
    iVar3 = this->count;
    while (iVar3 != 0) {
      __ptr = this->head->next;
      pmVar1 = __ptr->prev;
      pmVar2 = __ptr->next;
      pmVar2->prev = pmVar1;
      pmVar1->next = pmVar2;
      __ptr->next = __ptr;
      __ptr->prev = __ptr;
      if (this->destroy != (node_destructor)0x0) {
        (*this->destroy)(__ptr + 1);
      }
      free(__ptr);
      iVar3 = this->count + -1;
      this->count = iVar3;
    }
  }
  pthread_cond_signal((pthread_cond_t *)&(this->super_MppMutexCond).mCondition);
  return 0;
}

Assistant:

RK_S32 mpp_list::flush()
{
    if (head) {
        while (count) {
            mpp_list_node* node = head->next;
            mpp_list_del_init(node);
            if (destroy) {
                destroy((void*)(node + 1));
            }
            free(node);
            count--;
        }
    }
    signal();
    return 0;
}